

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMF.cpp
# Opt level: O3

DWORD __thiscall dsa::CSMF::ReadNextVnum(CSMF *this,int trk)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = ReadNextByte(this,trk);
  uVar2 = (uint)(bVar1 & 0x7f);
  while ((char)bVar1 < '\0') {
    bVar1 = ReadNextByte(this,trk);
    uVar2 = uVar2 << 7 | (uint)(bVar1 & 0x7f);
  }
  return (long)(int)uVar2;
}

Assistant:

DWORD CSMF::ReadNextVnum(int trk) {
  int ret, d;

  ret = d = ReadNextByte(trk);
  ret&=0x7F;
  while(d&0x80) {
    d = ReadNextByte(trk);
    ret = (ret<<7)|(d&0x7f);
  }
  return ret;
}